

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

WebPIDecoder *
WebPINewRGB(WEBP_CSP_MODE csp,uint8_t *output_buffer,size_t output_buffer_size,int output_stride)

{
  WebPIDecoder *pWVar1;
  WebPIDecoder *pWVar2;
  
  pWVar2 = (WebPIDecoder *)0x0;
  if (csp < MODE_YUV) {
    if (output_buffer == (uint8_t *)0x0) {
      output_stride = 0;
      output_buffer_size = 0;
    }
    else if (output_buffer_size == 0 || output_stride == 0) {
      return (WebPIDecoder *)0x0;
    }
    pWVar1 = NewDecoder((WebPDecBuffer *)0x0,(WebPBitstreamFeatures *)0x0);
    pWVar2 = (WebPIDecoder *)0x0;
    if (pWVar1 != (WebPIDecoder *)0x0) {
      (pWVar1->output).colorspace = csp;
      (pWVar1->output).is_external_memory = (uint)(output_buffer != (uint8_t *)0x0);
      (pWVar1->output).u.RGBA.rgba = output_buffer;
      (pWVar1->output).u.RGBA.stride = output_stride;
      (pWVar1->output).u.RGBA.size = output_buffer_size;
      pWVar2 = pWVar1;
    }
  }
  return pWVar2;
}

Assistant:

WebPIDecoder* WebPINewRGB(WEBP_CSP_MODE csp, uint8_t* output_buffer,
                          size_t output_buffer_size, int output_stride) {
  const int is_external_memory = (output_buffer != NULL) ? 1 : 0;
  WebPIDecoder* idec;

  if (csp >= MODE_YUV) return NULL;
  if (is_external_memory == 0) {    // Overwrite parameters to sane values.
    output_buffer_size = 0;
    output_stride = 0;
  } else {  // A buffer was passed. Validate the other params.
    if (output_stride == 0 || output_buffer_size == 0) {
      return NULL;   // invalid parameter.
    }
  }
  idec = WebPINewDecoder(NULL);
  if (idec == NULL) return NULL;
  idec->output.colorspace = csp;
  idec->output.is_external_memory = is_external_memory;
  idec->output.u.RGBA.rgba = output_buffer;
  idec->output.u.RGBA.stride = output_stride;
  idec->output.u.RGBA.size = output_buffer_size;
  return idec;
}